

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

bool __thiscall duckdb::RowGroup::InitializeScan(RowGroup *this,CollectionScanState *state)

{
  TableScanState *pTVar1;
  bool bVar2;
  const_reference pvVar3;
  ColumnData *pCVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  value_type column;
  StorageIndex local_50;
  
  pTVar1 = state->parent;
  bVar2 = CheckZonemap(this,&pTVar1->filters);
  if (bVar2) {
    state->row_group = this;
    state->vector_index = 0;
    if (state->max_row < (this->super_SegmentBase<duckdb::RowGroup>).start) {
      state->max_row_group_row = 0;
    }
    else {
      uVar6 = (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
              _M_i;
      uVar5 = state->max_row - (this->super_SegmentBase<duckdb::RowGroup>).start;
      if (uVar6 < uVar5) {
        uVar5 = uVar6;
      }
      state->max_row_group_row = uVar5;
      if (uVar5 != 0) {
        lVar7 = 0;
        for (uVar6 = 0;
            uVar6 < (ulong)((long)(pTVar1->column_ids).
                                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                  .
                                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar1->column_ids).
                                  super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                  .
                                  super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1
            ) {
          pvVar3 = vector<duckdb::StorageIndex,_true>::get<true>(&pTVar1->column_ids,uVar6);
          StorageIndex::StorageIndex(&local_50,pvVar3);
          if (local_50.index == 0xffffffffffffffff) {
            *(undefined8 *)
             ((long)&((state->column_scans).
                      super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                      .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl)->
                     current + lVar7) = 0;
          }
          else {
            pCVar4 = GetColumn(this,local_50.index);
            (*pCVar4->_vptr_ColumnData[7])
                      (pCVar4,(long)&((state->column_scans).
                                      super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                                      .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>.
                                     _M_head_impl)->current + lVar7);
            *(TableScanOptions **)
             ((long)&(((state->column_scans).
                       super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
                       .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl)->
                     scan_options).ptr + lVar7) = &state->parent->options;
          }
          ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
                    (&local_50.child_indexes.
                      super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
          lVar7 = lVar7 + 0x98;
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool RowGroup::InitializeScan(CollectionScanState &state) {
	auto &column_ids = state.GetColumnIds();
	auto &filters = state.GetFilterInfo();
	if (!CheckZonemap(filters)) {
		return false;
	}
	state.row_group = this;
	state.vector_index = 0;
	state.max_row_group_row =
	    this->start > state.max_row ? 0 : MinValue<idx_t>(this->count, state.max_row - this->start);
	if (state.max_row_group_row == 0) {
		return false;
	}
	D_ASSERT(state.column_scans);
	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto column = column_ids[i];
		if (!column.IsRowIdColumn()) {
			auto &column_data = GetColumn(column);
			column_data.InitializeScan(state.column_scans[i]);
			state.column_scans[i].scan_options = &state.GetOptions();
		} else {
			state.column_scans[i].current = nullptr;
		}
	}
	return true;
}